

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.c
# Opt level: O0

char * blogc_format_variable
                 (char *name,bc_trie_t *global,bc_trie_t *local,char *foreach_name,
                 bc_slist_t *foreach_var)

{
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  _Bool _Var4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  char *tmp;
  char *rv;
  char *value_var_1;
  char *pcStack_70;
  _Bool must_format;
  char *endptr;
  long len;
  size_t last;
  size_t i;
  char *var;
  char *value_var;
  char *value;
  bc_slist_t *foreach_var_local;
  char *foreach_name_local;
  bc_trie_t *local_local;
  bc_trie_t *global_local;
  char *name_local;
  
  value = (char *)foreach_var;
  foreach_var_local = (bc_slist_t *)foreach_name;
  foreach_name_local = (char *)local;
  local_local = global;
  global_local = (bc_trie_t *)name;
  value_var = blogc_get_variable(name,global,local);
  if (value_var == (char *)0x0) {
    iVar5 = strcmp((char *)global_local,"FOREACH_ITEM");
    if (iVar5 == 0) {
      if ((value == (char *)0x0) || (*(long *)(value + 8) == 0)) {
        name_local = (char *)0x0;
      }
      else {
        name_local = bc_strdup(*(char **)(value + 8));
      }
    }
    else {
      iVar5 = strcmp((char *)global_local,"FOREACH_VALUE");
      if (iVar5 == 0) {
        if (((foreach_var_local == (bc_slist_t *)0x0) || (value == (char *)0x0)) ||
           ((*(long *)(value + 8) == 0 ||
            (var = foreach_value_variable((char *)foreach_var_local,*(char **)(value + 8)),
            var == (char *)0x0)))) {
          name_local = (char *)0x0;
        }
        else {
          value_var = blogc_get_variable(var,local_local,(bc_trie_t *)foreach_name_local);
          free(var);
          name_local = bc_strdup(value_var);
        }
      }
      else {
        i = (size_t)bc_strdup((char *)global_local);
        len = strlen((char *)i);
        endptr = (char *)0xffffffffffffffff;
        sVar6 = len;
        do {
          uVar2 = sVar6;
          last = uVar2 - 1;
          bVar1 = false;
          if ((last != 0) && (bVar1 = false, '/' < *(char *)(i + last))) {
            bVar1 = *(char *)(i + last) < ':';
          }
          sVar6 = last;
        } while (bVar1);
        if ((*(char *)(i + last) == '_') && (uVar2 < (ulong)len)) {
          endptr = (char *)strtol((char *)(i + last + 1),&stack0xffffffffffffff90,10);
          if (*pcStack_70 == '\0') {
            *(undefined1 *)(i + last) = 0;
          }
          else {
            fprintf(_stderr,"warning: invalid variable size for \'%s\', ignoring.\n",i);
            endptr = (char *)0xffffffffffffffff;
          }
        }
        _Var4 = bc_str_ends_with((char *)i,"_FORMATTED");
        sVar3 = i;
        if (_Var4) {
          sVar6 = strlen((char *)i);
          *(undefined1 *)(sVar3 + (sVar6 - 10)) = 0;
        }
        iVar5 = strcmp((char *)i,"FOREACH_ITEM");
        if (((iVar5 == 0) && (value != (char *)0x0)) && (*(long *)(value + 8) != 0)) {
          value_var = *(char **)(value + 8);
        }
        else {
          iVar5 = strcmp((char *)i,"FOREACH_VALUE");
          if (((iVar5 == 0) && (foreach_var_local != (bc_slist_t *)0x0)) &&
             ((value != (char *)0x0 && (*(long *)(value + 8) != 0)))) {
            pcVar7 = foreach_value_variable((char *)foreach_var_local,*(char **)(value + 8));
            if (pcVar7 != (char *)0x0) {
              value_var = blogc_get_variable(pcVar7,local_local,(bc_trie_t *)foreach_name_local);
              free(pcVar7);
            }
          }
          else {
            blogc_funcvars_eval(local_local,(char *)i);
            value_var = blogc_get_variable((char *)i,local_local,(bc_trie_t *)foreach_name_local);
          }
        }
        if (value_var == (char *)0x0) {
          free((void *)i);
          name_local = (char *)0x0;
        }
        else {
          if (_Var4) {
            _Var4 = bc_str_starts_with((char *)global_local,"DATE_");
            if (_Var4) {
              tmp = blogc_format_date(value_var,local_local,(bc_trie_t *)foreach_name_local);
            }
            else {
              fprintf(_stderr,"warning: no formatter found for \'%s\', ignoring.\n",i);
              tmp = bc_strdup(value_var);
            }
          }
          else {
            tmp = bc_strdup(value_var);
          }
          free((void *)i);
          if (0 < (long)endptr) {
            pcVar7 = bc_strndup(tmp,(size_t)endptr);
            free(tmp);
            tmp = pcVar7;
          }
          name_local = tmp;
        }
      }
    }
  }
  else {
    name_local = bc_strdup(value_var);
  }
  return name_local;
}

Assistant:

char*
blogc_format_variable(const char *name, bc_trie_t *global, bc_trie_t *local,
    const char *foreach_name, bc_slist_t *foreach_var)
{
    // if used asked for a variable that exists, just return it right away
    const char *value = blogc_get_variable(name, global, local);
    if (value != NULL)
        return bc_strdup(value);

    // do the same for special foreach variables
    if (0 == strcmp(name, "FOREACH_ITEM")) {
        if (foreach_var != NULL && foreach_var->data != NULL) {
            return bc_strdup(foreach_var->data);
        }
        return NULL;
    }
    if (0 == strcmp(name, "FOREACH_VALUE")) {
        if (foreach_name != NULL && foreach_var != NULL && foreach_var->data != NULL) {
            char *value_var = foreach_value_variable(foreach_name, foreach_var->data);
            if (value_var != NULL) {
                value = blogc_get_variable(value_var, global, local);
                free(value_var);
                return bc_strdup(value);
            }
        }
        return NULL;
    }

    char *var = bc_strdup(name);

    size_t i;
    size_t last = strlen(var);

    long int len = -1;

    // just walk till the last '_'
    for (i = last - 1; i > 0 && var[i] >= '0' && var[i] <= '9'; i--);

    if (var[i] == '_' && (i + 1) < last) {  // var ends with '_[0-9]+'
        char *endptr;
        len = strtol(var + i + 1, &endptr, 10);
        if (*endptr != '\0') {
            fprintf(stderr, "warning: invalid variable size for '%s', "
                "ignoring.\n", var);
            len = -1;
        }
        else {
            var[i] = '\0';
        }
    }

    bool must_format = false;

    if (bc_str_ends_with(var, "_FORMATTED")) {
        var[strlen(var) - 10] = '\0';
        must_format = true;
    }

    if ((0 == strcmp(var, "FOREACH_ITEM")) &&
        (foreach_var != NULL && foreach_var->data != NULL)) {
        value = foreach_var->data;
    }
    else if ((0 == strcmp(var, "FOREACH_VALUE")) &&
        (foreach_name != NULL && foreach_var != NULL && foreach_var->data != NULL)) {
        char *value_var = foreach_value_variable(foreach_name, foreach_var->data);
        if (value_var != NULL) {
            value = blogc_get_variable(value_var, global, local);
            free(value_var);
        }
    }
    else {
        blogc_funcvars_eval(global, var);
        value = blogc_get_variable(var, global, local);
    }

    if (value == NULL) {
        free(var);
        return NULL;
    }

    char *rv = NULL;

    if (must_format) {
        if (bc_str_starts_with(name, "DATE_")) {
            rv = blogc_format_date(value, global, local);
        }
        else {
            fprintf(stderr, "warning: no formatter found for '%s', "
                "ignoring.\n", var);
            rv = bc_strdup(value);
        }
    }
    else {
        rv = bc_strdup(value);
    }

    free(var);

    if (len > 0) {
        char *tmp = bc_strndup(rv, len);
        free(rv);
        rv = tmp;
    }

    return rv;
}